

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O0

uint __thiscall
FMB::FiniteModelMultiSorted::evaluateGroundTerm(FiniteModelMultiSorted *this,Term *term)

{
  bool bVar1;
  uint uVar2;
  pair<unsigned_int,_unsigned_int> pVar3;
  uint *puVar4;
  undefined8 uVar5;
  size_t sVar6;
  Term *this_00;
  DArray<unsigned_int> *this_01;
  FiniteModelMultiSorted *in_RSI;
  DArray<unsigned_int> *in_RDI;
  uint s;
  uint i_1;
  uint mult;
  uint var;
  OperatorType *sig;
  uint i;
  DArray<unsigned_int> args;
  uint arity;
  undefined4 in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe7c;
  Signature *in_stack_fffffffffffffe80;
  OperatorType *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  Term *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  uint local_b4;
  int local_b0;
  uint local_ac;
  uint local_44;
  DArray<unsigned_int> local_40;
  uint local_24;
  Term *in_stack_ffffffffffffffe0;
  uint local_4;
  
  bVar1 = isDomainConstant((FiniteModelMultiSorted *)in_stack_fffffffffffffe80,
                           (Term *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  if (bVar1) {
    pVar3 = getDomainConstant((FiniteModelMultiSorted *)
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                              in_stack_fffffffffffffef0);
    local_4 = pVar3.first;
  }
  else {
    Kernel::Term::functor((Term *)in_RSI);
    local_24 = Kernel::Signature::functionArity(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c)
    ;
    Lib::DArray<unsigned_int>::DArray
              ((DArray<unsigned_int> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
               ,(size_t)in_stack_fffffffffffffe88);
    for (local_44 = 0; local_44 < local_24; local_44 = local_44 + 1) {
      Kernel::Term::nthArgument((Term *)in_RSI,local_44);
      Kernel::TermList::term((TermList *)0x2d67c0);
      uVar2 = evaluateGroundTerm(in_RSI,in_stack_ffffffffffffffe0);
      puVar4 = Lib::DArray<unsigned_int>::operator[](&local_40,(ulong)local_44);
      *puVar4 = uVar2;
      puVar4 = Lib::DArray<unsigned_int>::operator[](&local_40,(ulong)local_44);
      if (*puVar4 == 0) {
        uVar5 = __cxa_allocate_exception(0x50);
        Kernel::Term::toString_abi_cxx11_((Term *)this,term._7_1_);
        std::operator+((char *)in_stack_fffffffffffffe88,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe80);
        Lib::UserErrorException::Exception
                  ((UserErrorException *)in_stack_fffffffffffffe80,
                   (string *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        __cxa_throw(uVar5,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
    }
    Kernel::Term::functor((Term *)in_RSI);
    Kernel::Signature::getFunction(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    Kernel::Signature::Symbol::fnType
              ((Symbol *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    uVar2 = Kernel::Term::functor((Term *)in_RSI);
    puVar4 = Lib::DArray<unsigned_int>::operator[](in_RDI + 1,(ulong)uVar2);
    local_ac = *puVar4;
    local_b0 = 1;
    local_b4 = 0;
    while( true ) {
      sVar6 = Lib::DArray<unsigned_int>::size(&local_40);
      if (sVar6 <= local_b4) break;
      puVar4 = Lib::DArray<unsigned_int>::operator[](&local_40,(ulong)local_b4);
      local_ac = local_ac + local_b0 * (*puVar4 - 1);
      Kernel::OperatorType::arg
                (in_stack_fffffffffffffe88,(uint)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      this_00 = Kernel::TermList::term((TermList *)0x2d6af3);
      uVar2 = Kernel::Term::functor(this_00);
      in_stack_fffffffffffffe88 =
           (OperatorType *)Lib::DArray<unsigned_int>::operator[](in_RDI,(ulong)uVar2);
      local_b0 = *(uint *)&in_stack_fffffffffffffe88->_key * local_b0;
      local_b4 = local_b4 + 1;
    }
    this_01 = (DArray<unsigned_int> *)
              Lib::DArray<unsigned_int>::operator[](in_RDI + 3,(ulong)local_ac);
    local_4 = (uint)this_01->_size;
    Lib::DArray<unsigned_int>::~DArray(this_01);
  }
  return local_4;
}

Assistant:

unsigned FiniteModelMultiSorted::evaluateGroundTerm(Term* term)
{
  ASS(term->ground());

#if DEBUG_MODEL
  cout << "evaluating ground term " << term->toString() << endl;
  cout << "domain constant status " << isDomainConstant(term) << endl;
#endif
  if(isDomainConstant(term)) return getDomainConstant(term).first;

  unsigned arity = env.signature->functionArity(term->functor());
  DArray<unsigned> args(arity);
  for(unsigned i=0;i<arity;i++){
    args[i] = evaluateGroundTerm(term->nthArgument(i)->term());
    if(args[i]==0) USER_ERROR("Could not evaluate "+term->toString());
  }

  OperatorType* sig = env.signature->getFunction(term->functor())->fnType();
  unsigned var = _f_offsets[term->functor()];
  unsigned mult = 1;
  for(unsigned i=0;i<args.size();i++){
    var += mult*(args[i]-1);
    unsigned s = sig->arg(i).term()->functor();
    mult *=_sizes[s];
  }
#if VDEBUG
  if((term->functor()+1)<_f_offsets.size()) ASS_L(var,_f_offsets[term->functor()+1]);
#endif
  ASS_L(var,_f_interpretation.size());

  return _f_interpretation[var];
}